

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool read_header(BinarySource *src,char *header)

{
  uchar uVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    uVar1 = BinarySource_get_byte(src->binarysource_);
    if (uVar1 == '\n') {
      return false;
    }
    if (uVar1 == '\r') {
      return false;
    }
    if (src->binarysource_->err != BSE_NO_ERROR) {
      return false;
    }
    if (uVar1 == ':') break;
    if ((int)lVar2 == 0x27) {
      return false;
    }
    header[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  }
  uVar1 = BinarySource_get_byte(src->binarysource_);
  if (uVar1 != ' ') {
    return false;
  }
  header[lVar2] = '\0';
  return true;
}

Assistant:

static bool read_header(BinarySource *src, char *header)
{
    int len = 39;
    int c;

    while (1) {
        c = get_byte(src);
        if (c == '\n' || c == '\r' || get_err(src))
            return false;              /* failure */
        if (c == ':') {
            c = get_byte(src);
            if (c != ' ')
                return false;
            *header = '\0';
            return true;               /* success! */
        }
        if (len == 0)
            return false;              /* failure */
        *header++ = c;
        len--;
    }
    return false;                      /* failure */
}